

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.cpp
# Opt level: O0

void __thiscall TPZSavable::Write(TPZSavable *this,TPZStream *buf,int withclassid)

{
  int iVar1;
  int in_EDX;
  long *in_RDI;
  int var;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  
  pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  if ((in_EDX != 0) && (iVar1 = (**(code **)(*in_RDI + 0x20))(), iVar1 == -1)) {
    std::operator<<((ostream *)&std::cout,"TPZSavable::Write const with classid -1 expect trouble\n"
                   );
  }
  return;
}

Assistant:

void TPZSavable::Write(TPZStream &buf, int withclassid) const
{
    DebugStop();
	if(withclassid) { 
		int var = ClassId();
		if(var == -1)
		{
			std::cout << "TPZSavable::Write const with classid -1 expect trouble\n";
		}
		//buf.Write(&var,1);
	}
}